

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void mp::internal::
     ReadBinary<mp::internal::IdentityConverter,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
               (TextReader<fmt::Locale> *reader,NLHeader *header,
               NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *handler,int flags)

{
  BinaryReader<mp::internal::IdentityConverter> bin_reader;
  undefined1 local_80 [64];
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  local_40;
  
  ReaderBase::ReaderBase((ReaderBase *)local_80,&reader->super_ReaderBase);
  local_40.num_vars_and_exprs_ = 0;
  local_40.reader_ = (BinaryReader<mp::internal::IdentityConverter> *)local_80;
  local_40.header_ = header;
  local_40.handler_ = handler;
  local_40.flags_ = flags;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  ::Read(&local_40);
  std::__cxx11::string::~string((string *)(local_80 + 0x20));
  return;
}

Assistant:

void ReadBinary(TextReader<> &reader, const NLHeader &header,
                Handler &handler, int flags) {
  BinaryReader<InputConverter> bin_reader(reader);
  NLReader<BinaryReader<InputConverter>, Handler>(
        bin_reader, header, handler, flags).Read();
}